

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

uint32_t __thiscall capnp::ConstSchema::getValueSchemaOffset(ConstSchema *this)

{
  uint32_t uVar1;
  Reader local_a0;
  Reader local_70;
  Reader local_40;
  ConstSchema *local_10;
  ConstSchema *this_local;
  
  local_10 = this;
  Schema::getProto(&local_a0,&this->super_Schema);
  capnp::schema::Node::Reader::getConst(&local_70,&local_a0);
  capnp::schema::Node::Const::Reader::getValue(&local_40,&local_70);
  uVar1 = Schema::getSchemaOffset(&this->super_Schema,&local_40);
  return uVar1;
}

Assistant:

uint32_t ConstSchema::getValueSchemaOffset() const {
  return getSchemaOffset(getProto().getConst().getValue());
}